

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

ExpEmit __thiscall FxCompoundStatement::Emit(FxCompoundStatement *this,VMFunctionBuilder *build)

{
  bool bVar1;
  ExpEmit EVar2;
  FxLocalVariableDeclaration **ppFVar3;
  FxLocalVariableDeclaration *l;
  iterator __end1;
  iterator __begin1;
  TArray<FxLocalVariableDeclaration_*,_FxLocalVariableDeclaration_*> *__range1;
  VMFunctionBuilder *build_local;
  FxCompoundStatement *this_local;
  ExpEmit e;
  
  EVar2 = FxSequence::Emit(&this->super_FxSequence,build);
  __end1 = TArray<FxLocalVariableDeclaration_*,_FxLocalVariableDeclaration_*>::begin
                     (&this->LocalVars);
  l = (FxLocalVariableDeclaration *)
      TArray<FxLocalVariableDeclaration_*,_FxLocalVariableDeclaration_*>::end(&this->LocalVars);
  while( true ) {
    bVar1 = TIterator<FxLocalVariableDeclaration_*>::operator!=
                      (&__end1,(TIterator<FxLocalVariableDeclaration_*> *)&l);
    if (!bVar1) break;
    ppFVar3 = TIterator<FxLocalVariableDeclaration_*>::operator*(&__end1);
    FxLocalVariableDeclaration::Release(*ppFVar3,build);
    TIterator<FxLocalVariableDeclaration_*>::operator++(&__end1);
  }
  return EVar2;
}

Assistant:

ExpEmit FxCompoundStatement::Emit(VMFunctionBuilder *build)
{
	auto e = FxSequence::Emit(build);
	// Release all local variables in this block.
	for (auto l : LocalVars)
	{
		l->Release(build);
	}
	return e;
}